

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O1

Wlc_Ntk_t * Wlc_NtkGraftMulti(Wlc_Ntk_t *p,int fVerbose)

{
  Wlc_Obj_t *pWlcObj;
  uint uVar1;
  int iVar2;
  Wlc_Obj_t *pWVar3;
  word **ppwVar4;
  int t;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  Gia_Man_t *p_00;
  Vec_Mem_t *p_01;
  Vec_Wrd_t *pVVar7;
  word *pwVar8;
  ulong uVar9;
  word wVar10;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  char *__s;
  int iVar16;
  Vec_Int_t *__ptr;
  uint uVar17;
  int nMultiRHS;
  int nMultiLHS;
  int local_50;
  int local_4c;
  Vec_Int_t *local_48;
  word *local_40;
  Vec_Int_t *local_38;
  
  pVVar5 = Wlc_NtkCollectObjs(p,0,&local_4c);
  pVVar6 = Wlc_NtkCollectObjs(p,1,&local_50);
  p_00 = Wlc_NtkBitBlast(p,(Wlc_BstPar_t *)0x0);
  p_01 = (Vec_Mem_t *)calloc(1,0x30);
  p_01->nEntrySize = 4;
  p_01->LogPageSze = 10;
  p_01->PageMask = 0x3ff;
  p_01->iPage = -1;
  Vec_MemHashAlloc(p_01,10000);
  iVar14 = local_4c;
  if (local_4c == 0 && local_50 == 0) {
    __s = "No multipliers are present.";
  }
  else {
    if (local_50 < 1 || local_4c < 1) {
      __ptr = pVVar6;
      if (0 < local_50) {
        local_4c = local_50;
        local_50 = iVar14;
        __ptr = pVVar5;
        pVVar5 = pVVar6;
      }
      if (local_4c < 1) {
        __assert_fail("nMultiLHS > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                      ,0xeb,"Wlc_Ntk_t *Wlc_NtkGraftMulti(Wlc_Ntk_t *, int)");
      }
      if (local_50 != 0) {
        __assert_fail("nMultiRHS == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                      ,0xec,"Wlc_Ntk_t *Wlc_NtkGraftMulti(Wlc_Ntk_t *, int)");
      }
      if (p_00->vSims != (Vec_Wrd_t *)0x0) {
        pwVar8 = p_00->vSims->pArray;
        if (pwVar8 != (word *)0x0) {
          free(pwVar8);
          p_00->vSims->pArray = (word *)0x0;
        }
        if (p_00->vSims != (Vec_Wrd_t *)0x0) {
          free(p_00->vSims);
          p_00->vSims = (Vec_Wrd_t *)0x0;
        }
      }
      iVar14 = p_00->nObjs;
      pVVar7 = (Vec_Wrd_t *)malloc(0x10);
      iVar2 = (int)((long)iVar14 << 2);
      iVar16 = 0x10;
      if (0xe < iVar2 - 1U) {
        iVar16 = iVar2;
      }
      pVVar7->nSize = 0;
      pVVar7->nCap = iVar16;
      if (iVar16 == 0) {
        pwVar8 = (word *)0x0;
      }
      else {
        pwVar8 = (word *)malloc((long)iVar16 << 3);
      }
      pVVar7->pArray = pwVar8;
      pVVar7->nSize = iVar2;
      memset(pwVar8,0,(long)iVar14 << 5);
      p_00->vSims = pVVar7;
      p_00->nSimWords = 4;
      Gia_ManRandomW(1);
      local_48 = pVVar5;
      if (1 < p_00->nObjs) {
        lVar15 = 1;
        local_38 = __ptr;
        do {
          uVar17 = (uint)*(ulong *)(p_00->pObjs + lVar15);
          uVar9 = *(ulong *)(p_00->pObjs + lVar15) & 0x1fffffff;
          iVar14 = (int)lVar15;
          if (uVar9 == 0x1fffffff || (int)uVar17 < 0) {
            if ((int)uVar17 < 0 && (int)uVar9 != 0x1fffffff) {
              uVar1 = p_00->nSimWords;
              if ((int)(iVar14 * uVar1) < 0) goto LAB_0035abc9;
              iVar2 = p_00->vSims->nSize;
              if (iVar2 <= (int)(iVar14 * uVar1)) goto LAB_0035abc9;
              uVar12 = uVar17 & 0x1fffffff;
              iVar16 = (iVar14 - uVar12) * uVar1;
              if ((iVar16 < 0) || (iVar2 <= iVar16)) goto LAB_0035abc9;
              pwVar8 = p_00->vSims->pArray;
              if ((uVar17 >> 0x1d & 1) == 0) {
                if (0 < (int)uVar1) {
                  uVar9 = 0;
                  do {
                    pwVar8[uVar1 * iVar14 + uVar9] = pwVar8[(iVar14 - uVar12) * uVar1 + uVar9];
                    uVar9 = uVar9 + 1;
                  } while (uVar1 != uVar9);
                }
              }
              else if (0 < (int)uVar1) {
                uVar9 = 0;
                do {
                  pwVar8[uVar1 * iVar14 + uVar9] = ~pwVar8[(iVar14 - uVar12) * uVar1 + uVar9];
                  uVar9 = uVar9 + 1;
                } while (uVar1 != uVar9);
              }
            }
            else {
              if ((~uVar17 & 0x9fffffff) != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                              ,0xfc,"Wlc_Ntk_t *Wlc_NtkGraftMulti(Wlc_Ntk_t *, int)");
              }
              iVar2 = p_00->nSimWords;
              uVar17 = iVar14 * iVar2;
              if (((int)uVar17 < 0) || (p_00->vSims->nSize <= (int)uVar17)) goto LAB_0035abc9;
              pwVar8 = p_00->vSims->pArray;
              local_40 = pwVar8;
              if (0 < iVar2) {
                lVar13 = 0;
                do {
                  wVar10 = Gia_ManRandomW(0);
                  pwVar8[(ulong)(uint)(iVar2 * iVar14) + lVar13] = wVar10;
                  lVar13 = lVar13 + 1;
                } while (lVar13 < p_00->nSimWords);
              }
              local_40[uVar17] = local_40[uVar17] << 1;
              __ptr = local_38;
              pVVar5 = local_48;
            }
          }
          else {
            Wlc_ObjSimAnd(p_00,iVar14);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < p_00->nObjs);
      }
      if (p_00->vSims->nSize < 1) {
LAB_0035abc9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      Vec_MemHashInsert(p_01,p_00->vSims->pArray);
      if (0 < pVVar5->nSize) {
        lVar15 = 0;
        do {
          lVar13 = (long)pVVar5->pArray[lVar15];
          if ((lVar13 < 1) || (p->nObjsAlloc <= pVVar5->pArray[lVar15])) goto LAB_0035abaa;
          pWVar3 = p->pObjs;
          if ((undefined1  [24])((undefined1  [24])pWVar3[lVar13] & (undefined1  [24])0x3f) ==
              (undefined1  [24])0x2d) {
            pWlcObj = pWVar3 + lVar13;
            paVar11 = &pWlcObj->field_10;
            if (2 < pWlcObj->nFanins) {
              paVar11 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar11->pFanins[0];
            }
            iVar14 = paVar11->Fanins[0];
            if (((long)iVar14 < 1) || (p->nObjsAlloc <= iVar14)) goto LAB_0035abaa;
            Wlc_NtkSaveOneNode(p,pWVar3 + iVar14,p_00,p_01);
            if ((pWlcObj->nFanins < 3) &&
               ((undefined1  [24])((undefined1  [24])*pWlcObj & (undefined1  [24])0x2f) !=
                (undefined1  [24])0x6)) {
              paVar11 = &pWlcObj->field_10;
            }
            else {
              paVar11 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWlcObj->field_10).pFanins[0];
            }
            iVar14 = paVar11->Fanins[1];
            if (((long)iVar14 < 1) || (p->nObjsAlloc <= iVar14)) goto LAB_0035abaa;
            Wlc_NtkSaveOneNode(p,p->pObjs + iVar14,p_00,p_01);
            Wlc_NtkSaveOneNode(p,pWlcObj,p_00,p_01);
            pVVar5 = local_48;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar5->nSize);
      }
      if (0 < __ptr->nSize) {
        lVar15 = 0;
        do {
          iVar14 = __ptr->pArray[lVar15];
          if (((long)iVar14 < 1) || (p->nObjsAlloc <= iVar14)) {
LAB_0035abaa:
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                          ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
          Wlc_NtkFindOneNode(p,p->pObjs + iVar14,p_00,p_01);
          lVar15 = lVar15 + 1;
        } while (lVar15 < __ptr->nSize);
      }
      pVVar5 = p_01->vTable;
      if (pVVar5 != (Vec_Int_t *)0x0) {
        if (pVVar5->pArray != (int *)0x0) {
          free(pVVar5->pArray);
          pVVar5->pArray = (int *)0x0;
        }
        free(pVVar5);
        p_01->vTable = (Vec_Int_t *)0x0;
      }
      pVVar5 = p_01->vNexts;
      if (pVVar5 != (Vec_Int_t *)0x0) {
        if (pVVar5->pArray != (int *)0x0) {
          free(pVVar5->pArray);
          pVVar5->pArray = (int *)0x0;
        }
        free(pVVar5);
        p_01->vNexts = (Vec_Int_t *)0x0;
      }
      uVar17 = p_01->iPage;
      if (-1 < (int)uVar17) {
        ppwVar4 = p_01->ppPages;
        lVar15 = 0;
        do {
          pwVar8 = ppwVar4[lVar15];
          if (pwVar8 != (word *)0x0) {
            free(pwVar8);
            ppwVar4[lVar15] = (word *)0x0;
          }
          lVar15 = lVar15 + 1;
        } while ((ulong)uVar17 + 1 != lVar15);
      }
      if (p_01->ppPages != (word **)0x0) {
        free(p_01->ppPages);
        p_01->ppPages = (word **)0x0;
      }
      free(p_01);
      pVVar5 = local_48;
      if (p_00->vSims != (Vec_Wrd_t *)0x0) {
        pwVar8 = p_00->vSims->pArray;
        if (pwVar8 != (word *)0x0) {
          free(pwVar8);
          p_00->vSims->pArray = (word *)0x0;
        }
        if (p_00->vSims != (Vec_Wrd_t *)0x0) {
          free(p_00->vSims);
          p_00->vSims = (Vec_Wrd_t *)0x0;
        }
      }
      p_00->nSimWords = 0;
      if (pVVar5->pArray != (int *)0x0) {
        free(pVVar5->pArray);
        pVVar5->pArray = (int *)0x0;
      }
      if (pVVar5 != (Vec_Int_t *)0x0) {
        free(pVVar5);
      }
      if (__ptr->pArray != (int *)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (int *)0x0;
      }
      if (__ptr != (Vec_Int_t *)0x0) {
        free(__ptr);
      }
      Gia_ManStop(p_00);
      return (Wlc_Ntk_t *)0x0;
    }
    __s = "Multipliers are present in both sides of the miter.";
  }
  puts(__s);
  return (Wlc_Ntk_t *)0x0;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkGraftMulti( Wlc_Ntk_t * p, int fVerbose )
{
    int nWords = 4;
    int i, nMultiLHS, nMultiRHS;
    word * pInfoObj;
    Wlc_Ntk_t * pNew = NULL;
    Wlc_Obj_t * pWlcObj;
    Gia_Obj_t * pObj;
    Vec_Int_t * vObjsLHS = Wlc_NtkCollectObjs( p, 0, &nMultiLHS );
    Vec_Int_t * vObjsRHS = Wlc_NtkCollectObjs( p, 1, &nMultiRHS );
    Gia_Man_t * pGia = Wlc_NtkBitBlast( p, NULL ); //, -1, 0, 0, 0, 0, 1, 0, 0 ); // <= no cleanup
    Vec_Mem_t * vTtMem = Vec_MemAlloc( nWords, 10 );
    Vec_MemHashAlloc( vTtMem, 10000 );

    // check if there are multipliers
    if ( nMultiLHS == 0 && nMultiRHS == 0 )
    {
        printf( "No multipliers are present.\n" );
        return NULL;
    }
    // compare multipliers
    if ( nMultiLHS > 0 && nMultiRHS > 0 )
    {
        printf( "Multipliers are present in both sides of the miter.\n" );
        return NULL;
    }
    // swap if wrong side
    if ( nMultiRHS > 0 )
    {
        ABC_SWAP( Vec_Int_t *, vObjsLHS, vObjsRHS );
        ABC_SWAP( int, nMultiLHS, nMultiRHS );
    }
    assert( nMultiLHS > 0 );
    assert( nMultiRHS == 0 );

    // allocate simulation info for one timeframe
    Vec_WrdFreeP( &pGia->vSims );
    pGia->vSims = Vec_WrdStart( Gia_ManObjNum(pGia) * nWords );
    pGia->nSimWords = nWords;
    // perform simulation
    Gia_ManRandomW( 1 );
    Gia_ManForEachObj1( pGia, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Wlc_ObjSimAnd( pGia, i );
        else if ( Gia_ObjIsCo(pObj) )
            Wlc_ObjSimCo( pGia, i );
        else if ( Gia_ObjIsCi(pObj) )
            Wlc_ObjSimPi( pGia, i );
        else assert( 0 );
    }

    // hash constant 0
    pInfoObj = Wlc_ObjSim( pGia, 0 );
    Vec_MemHashInsert( vTtMem, pInfoObj );

    // hash sim info on the multiplier boundary
    Wlc_NtkForEachObjVec( vObjsLHS, p, pWlcObj, i )
        if ( Wlc_ObjType(pWlcObj) == WLC_OBJ_ARI_MULTI )
        {
            Wlc_NtkSaveOneNode( p, Wlc_ObjFanin0(p, pWlcObj), pGia, vTtMem );
            Wlc_NtkSaveOneNode( p, Wlc_ObjFanin1(p, pWlcObj), pGia, vTtMem );
            Wlc_NtkSaveOneNode( p, pWlcObj, pGia, vTtMem );
        }

    // check if there are similar signals in LHS
    Wlc_NtkForEachObjVec( vObjsRHS, p, pWlcObj, i )
        Wlc_NtkFindOneNode( p, pWlcObj, pGia, vTtMem );

    // perform grafting


    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );

    // cleanup
    Vec_WrdFreeP( &pGia->vSims );
    pGia->nSimWords = 0;

    Vec_IntFree( vObjsLHS );
    Vec_IntFree( vObjsRHS );
    Gia_ManStop( pGia );
    return pNew;
}